

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetUserData(void *kinmem,void *user_data)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0x38,"KINSetUserData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *(void **)((long)kinmem + 0x18) = user_data;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetUserData(void* kinmem, void* user_data)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem                = (KINMem)kinmem;
  kin_mem->kin_user_data = user_data;

  return (KIN_SUCCESS);
}